

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O1

int __thiscall AtomicFile::impl::truncate(impl *this,char *__file,__off_t __length)

{
  int iVar1;
  
  iVar1 = File::truncate(&this->temp_file,__file,__length);
  this->is_temp_active = true;
  return iVar1;
}

Assistant:

void AtomicFile::impl::truncate ()
{
  try 
  {
    temp_file.truncate ();
    is_temp_active = true;
  }
  catch (...)
  {
    allow_atomics = false;
    throw;
  }
}